

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O1

optional<unsigned_long> ParseByteUnits(string_view str,ByteUnit default_multiplier)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  _Storage<unsigned_long,_true> in_RCX;
  undefined8 uVar4;
  ByteUnit BVar5;
  char *__first;
  ulong uVar6;
  char *__last;
  long in_FS_OFFSET;
  bool bVar8;
  bool bVar9;
  __integer_from_chars_result_type<unsigned_long> _Var10;
  optional<unsigned_long> oVar11;
  unsigned_long result;
  ulong local_20;
  long local_18;
  ulong uVar7;
  
  __first = str._M_str;
  uVar6 = str._M_len;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (uVar6 != 0) {
    bVar3 = __first[uVar6 - 1];
    if (bVar3 < 0x67) {
      if (bVar3 < 0x4d) {
        if (bVar3 == 0x47) {
          BVar5 = G;
        }
        else if (bVar3 == 0x4b) {
          BVar5 = K;
        }
        else {
LAB_00e20275:
          bVar3 = 0;
          BVar5 = default_multiplier;
        }
      }
      else if (bVar3 == 0x4d) {
        BVar5 = M;
      }
      else {
        if (bVar3 != 0x54) goto LAB_00e20275;
        BVar5 = T;
      }
    }
    else if (bVar3 < 0x6d) {
      if (bVar3 == 0x67) {
        BVar5 = g;
      }
      else {
        BVar5 = k;
        if (bVar3 != 0x6b) goto LAB_00e20275;
      }
    }
    else if (bVar3 == 0x6d) {
      BVar5 = m;
    }
    else {
      if (bVar3 != 0x74) goto LAB_00e20275;
      BVar5 = t;
    }
    uVar7 = uVar6 - 1;
    if (uVar6 < uVar6 - 1) {
      uVar7 = uVar6;
    }
    if (bVar3 == 0) {
      uVar7 = uVar6;
    }
    __last = __first + uVar7;
    uVar4 = 0;
    _Var10 = std::from_chars<unsigned_long>(__first,__last,&local_20,10);
    bVar8 = _Var10.ptr == __last;
    bVar9 = _Var10.ec == 0;
    in_RCX._1_7_ = (undefined7)((ulong)uVar4 >> 8);
    in_RCX._0_1_ = bVar9 && bVar8;
    if (bVar9 && bVar8) {
      in_RCX._M_value = local_20 * BVar5;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = BVar5;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_20;
      uVar4 = CONCAT71(SUB167(auVar1 * auVar2,9),SUB168(auVar1 * auVar2,8) == 0);
      goto LAB_00e202ce;
    }
  }
  uVar4 = 0;
LAB_00e202ce:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  oVar11.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar4;
  oVar11.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = in_RCX._M_value;
  return (optional<unsigned_long>)
         oVar11.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> ParseByteUnits(std::string_view str, ByteUnit default_multiplier)
{
    if (str.empty()) {
        return std::nullopt;
    }
    auto multiplier = default_multiplier;
    char unit = str.back();
    switch (unit) {
    case 'k':
        multiplier = ByteUnit::k;
        break;
    case 'K':
        multiplier = ByteUnit::K;
        break;
    case 'm':
        multiplier = ByteUnit::m;
        break;
    case 'M':
        multiplier = ByteUnit::M;
        break;
    case 'g':
        multiplier = ByteUnit::g;
        break;
    case 'G':
        multiplier = ByteUnit::G;
        break;
    case 't':
        multiplier = ByteUnit::t;
        break;
    case 'T':
        multiplier = ByteUnit::T;
        break;
    default:
        unit = 0;
        break;
    }

    uint64_t unit_amount = static_cast<uint64_t>(multiplier);
    auto parsed_num = ToIntegral<uint64_t>(unit ? str.substr(0, str.size() - 1) : str);
    if (!parsed_num || parsed_num > std::numeric_limits<uint64_t>::max() / unit_amount) { // check overflow
        return std::nullopt;
    }
    return *parsed_num * unit_amount;
}